

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86_avx::forward
          (MultiHeadAttention_x86_avx *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  ulong *puVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  pointer pMVar5;
  undefined8 uVar6;
  ulong uVar7;
  undefined8 uVar8;
  size_t sVar9;
  _func_int ***ppp_Var10;
  Allocator *pAVar11;
  int iVar12;
  void *pvVar13;
  Allocator *pAVar14;
  undefined4 uVar15;
  long *plVar16;
  undefined4 uVar17;
  int iVar18;
  int _w;
  int iVar19;
  long lVar20;
  pointer pMVar21;
  void *pvVar22;
  long *plVar23;
  void *pvVar24;
  long lVar25;
  int *piVar26;
  long lVar27;
  long lVar28;
  Option opt1;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  long local_390;
  long local_388;
  value_type local_378;
  long local_330;
  Mat local_328;
  MultiHeadAttention_x86_avx *local_2d8;
  int *local_2d0;
  Mat local_2c8;
  Mat local_278;
  vector<int,_std::allocator<int>_> local_228;
  vector<int,_std::allocator<int>_> local_208;
  Mat local_1e8;
  long local_1a0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_198;
  pointer local_190;
  undefined1 local_188 [64];
  void *local_148;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 local_138;
  undefined4 uStack_134;
  undefined4 local_130;
  long *local_128;
  undefined4 uStack_120;
  int iStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined8 local_108;
  void *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  long *local_d8;
  undefined4 uStack_d0;
  int iStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_c0;
  undefined8 local_b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_a8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_90;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> local_78;
  int iStack_60;
  bool bStack_5c;
  bool bStack_5b;
  bool bStack_5a;
  bool bStack_59;
  Allocator *local_58;
  int iStack_50;
  bool bStack_4c;
  bool bStack_4b;
  bool bStack_4a;
  bool bStack_49;
  int iStack_48;
  bool bStack_44;
  bool bStack_43;
  bool bStack_42;
  bool bStack_41;
  bool bStack_40;
  bool bStack_3f;
  bool bStack_3e;
  bool bStack_3d;
  bool bStack_3c;
  bool bStack_3b;
  bool bStack_3a;
  bool bStack_39;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar20 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar5;
  pMVar21 = pMVar5;
  local_190 = pMVar5;
  if (lVar20 == 0x48) {
    iVar19 = (this->super_MultiHeadAttention).attn_mask;
LAB_00524a69:
    if (iVar19 != 0) goto LAB_00524ab7;
    local_2c8.cstep = 0;
    local_2c8.data = (Allocator *)0x0;
    local_2c8.refcount._0_4_ = 0;
    local_2c8.refcount._4_4_ = 0;
    local_2c8.elemsize._0_4_ = 0;
    local_2c8.elemsize._4_4_ = 0;
    local_2c8.elempack = 0;
    local_2c8.allocator = (Allocator *)0x0;
    local_2c8.dims = 0;
    local_2c8.w = 0;
    local_2c8.h = 0;
    local_2c8.d = 0;
    local_2c8.c = 0;
  }
  else {
    iVar19 = (this->super_MultiHeadAttention).attn_mask;
    if (iVar19 == 0 || lVar20 != 0x90) {
      pMVar21 = pMVar5 + 1;
      local_190 = pMVar21;
      if (iVar19 == 0) {
        local_190 = pMVar5 + 2;
      }
      if (lVar20 != 0xd8) {
        local_190 = pMVar5 + 2;
      }
      if (lVar20 == 0x90) {
        local_190 = pMVar21;
      }
      goto LAB_00524a69;
    }
LAB_00524ab7:
    piVar26 = *(int **)((long)pMVar5 + lVar20 + -0x40);
    puVar1 = (ulong *)((long)pMVar5 + lVar20 + -0x48);
    local_2c8.data = (void *)*puVar1;
    uVar7 = puVar1[1];
    local_2c8.refcount._0_4_ = (int)uVar7;
    local_2c8.refcount._4_4_ = (int)(uVar7 >> 0x20);
    uVar6 = *(undefined8 *)((long)pMVar5 + lVar20 + -0x38);
    local_2c8.elemsize._0_4_ = (undefined4)uVar6;
    local_2c8.elemsize._4_4_ = (undefined4)((ulong)uVar6 >> 0x20);
    local_2c8.elempack = *(int *)((long)pMVar5 + lVar20 + -0x30);
    local_2c8.allocator = *(Allocator **)((long)pMVar5 + lVar20 + -0x28);
    puVar2 = (undefined8 *)((long)pMVar5 + lVar20 + -0x20);
    uVar6 = *puVar2;
    uVar8 = puVar2[1];
    local_2c8.dims = (int)uVar6;
    local_2c8.w = (int)((ulong)uVar6 >> 0x20);
    local_2c8.h = (int)uVar8;
    local_2c8.d = (int)((ulong)uVar8 >> 0x20);
    local_2c8.c = *(int *)((long)pMVar5 + lVar20 + -0x10);
    local_2c8.cstep = *(ulong *)((long)pMVar5 + lVar20 + -8);
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + 1;
      UNLOCK();
    }
  }
  local_2d0 = &(this->super_MultiHeadAttention).attn_mask;
  local_188[0] = _opt->lightmode;
  local_188[1] = _opt->use_shader_pack8;
  local_188[2] = _opt->use_subgroup_ops;
  local_188[3] = _opt->use_reserved_0;
  local_188._4_4_ = _opt->num_threads;
  local_188._8_8_ = _opt->blob_allocator;
  local_188._16_8_ = _opt->workspace_allocator;
  local_188._24_4_ = _opt->openmp_blocktime;
  local_188[0x1c] = _opt->use_winograd_convolution;
  local_188[0x1d] = _opt->use_sgemm_convolution;
  local_188[0x1e] = _opt->use_int8_inference;
  local_188[0x1f] = _opt->use_vulkan_compute;
  local_188._32_8_ = *(undefined8 *)&_opt->use_bf16_storage;
  local_188._40_4_ = _opt->vulkan_device_index;
  local_188[0x2c] = _opt->use_reserved_1;
  local_188[0x2d] = _opt->use_image_storage;
  local_188[0x2e] = _opt->use_tensor_storage;
  local_188[0x2f] = _opt->use_reserved_2;
  local_188._48_4_ = _opt->flush_denormals;
  local_188[0x34] = _opt->use_local_pool_allocator;
  local_188[0x35] = _opt->use_shader_local_memory;
  local_188[0x36] = _opt->use_cooperative_matrix;
  local_188[0x37] = _opt->use_winograd23_convolution;
  local_188[0x38] = _opt->use_winograd43_convolution;
  local_188[0x39] = _opt->use_winograd63_convolution;
  local_188[0x3a] = _opt->use_a53_a55_optimized_kernel;
  local_188[0x3b] = _opt->use_fp16_uniform;
  local_188[0x3c] = _opt->use_int8_uniform;
  local_188[0x3d] = _opt->use_reserved_9;
  local_188[0x3e] = _opt->use_reserved_10;
  local_188[0x3f] = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    local_188._32_8_ = local_188._32_8_ & 0xffffffffffffff;
  }
  local_328.cstep = 0;
  local_328.data = (Allocator *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize = 0;
  local_328.elempack = 0;
  local_328.h = 0;
  local_198 = top_blobs;
  if ((*local_2d0 == 0) || (local_2c8.elempack == 1)) {
    piVar26 = (int *)CONCAT44(local_2c8.refcount._4_4_,(int)local_2c8.refcount);
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + 1;
      UNLOCK();
    }
    local_328.data = local_2c8.data;
    local_328.refcount._0_4_ = (int)local_2c8.refcount;
    local_328.refcount._4_4_ = local_2c8.refcount._4_4_;
    local_328.elemsize = CONCAT44(local_2c8.elemsize._4_4_,(undefined4)local_2c8.elemsize);
    local_328.elempack = local_2c8.elempack;
    local_328.allocator = local_2c8.allocator;
    local_328.dims = local_2c8.dims;
    local_328.w = local_2c8.w;
    local_328.h = local_2c8.h;
    local_328.d = local_2c8.d;
    local_328.c = local_2c8.c;
    local_328.cstep = local_2c8.cstep;
  }
  else {
    local_328.allocator = (Allocator *)local_328.data;
    local_328.dims = (int)local_328.refcount;
    local_328.w = local_328.refcount._4_4_;
    local_328.d = (int)local_328.refcount;
    local_328.c = local_328.elempack;
    convert_packing(&local_2c8,&local_328,1,(Option *)local_188);
    iVar19 = -100;
    if (((Allocator *)local_328.data == (Allocator *)0x0) ||
       ((long)local_328.c * local_328.cstep == 0)) goto LAB_00525393;
  }
  iVar18 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar5->elempack * pMVar5->h;
  iVar3 = pMVar21->elempack;
  iVar4 = pMVar21->h;
  local_b8 = 0;
  local_f8 = (void *)0x0;
  uStack_f0 = 0;
  uStack_ec = 0;
  local_e8 = 0;
  uStack_e4 = 0;
  local_e0 = 0;
  local_d8 = (long *)0x0;
  uStack_d0 = 0;
  iStack_cc = 0;
  uStack_c8 = 0;
  uStack_c4 = 0;
  local_c0 = 0;
  iVar19 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar5,&local_f8,local_188);
  if (iVar19 == 0) {
    local_108 = 0;
    local_148 = (void *)0x0;
    uStack_140 = 0;
    uStack_13c = 0;
    local_138 = 0;
    uStack_134 = 0;
    local_130 = 0;
    local_128 = (long *)0x0;
    uStack_120 = 0;
    iStack_11c = 0;
    uStack_118 = 0;
    uStack_114 = 0;
    local_110 = 0;
    iVar19 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar21,&local_148,local_188);
    if (iVar19 == 0) {
      local_1e8.cstep = 0;
      local_1e8.data = (void *)0x0;
      local_1e8.refcount._0_4_ = 0;
      local_1e8.refcount._4_4_ = 0;
      local_1e8.elemsize._0_4_ = 0;
      local_1e8.elemsize._4_4_ = 0;
      local_1e8.elempack = 0;
      local_1e8.allocator = (Allocator *)0x0;
      local_1e8.dims = 0;
      local_1e8.w = 0;
      local_1e8.h = 0;
      local_1e8.d = 0;
      local_1e8.c = 0;
      Mat::create(&local_1e8,iVar3 * iVar4,(this->super_MultiHeadAttention).num_heads * _w,4,
                  (Allocator *)local_188._8_8_);
      iVar19 = -100;
      if ((local_1e8.data != (void *)0x0) && ((long)local_1e8.c * local_1e8.cstep != 0)) {
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&local_208,(long)(this->super_MultiHeadAttention).num_heads);
        if (0 < (this->super_MultiHeadAttention).num_heads) {
          lVar20 = (long)iVar18;
          local_1a0 = (long)_w;
          lVar25 = 0;
          local_330 = 0;
          local_388 = 0;
          local_2d8 = this;
          do {
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_278,2,
                       (allocator_type *)&local_378);
            iVar19 = iStack_cc;
            plVar23 = local_d8;
            uVar17 = local_e0;
            pvVar22 = local_278.data;
            lVar27 = (long)iStack_cc;
            lVar28 = CONCAT44(uStack_e4,local_e8);
            pvVar24 = (void *)(lVar25 * lVar27 * lVar28 + (long)local_f8);
            piVar26 = *(int **)((long)local_278.data + 8);
            if (piVar26 != (int *)0x0) {
              LOCK();
              *piVar26 = *piVar26 + -1;
              UNLOCK();
              if (*piVar26 == 0) {
                if (*(long **)((long)local_278.data + 0x20) == (long *)0x0) {
                  if (*local_278.data != (void *)0x0) {
                    free(*local_278.data);
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_278.data + 0x20) + 0x18))();
                }
              }
            }
            iVar3 = iStack_11c;
            plVar16 = local_128;
            uVar15 = local_130;
            pvVar13 = local_278.data;
            *(void **)pvVar22 = pvVar24;
            *(long *)((long)pvVar22 + 8) = 0;
            *(long *)((long)pvVar22 + 0x10) = lVar28;
            *(undefined4 *)((long)pvVar22 + 0x18) = uVar17;
            *(long **)((long)pvVar22 + 0x20) = plVar23;
            *(undefined4 *)((long)pvVar22 + 0x28) = 2;
            *(int *)((long)pvVar22 + 0x2c) = iVar19;
            *(int *)((long)pvVar22 + 0x30) = iVar18;
            *(undefined8 *)((long)pvVar22 + 0x34) = 0x100000001;
            *(long *)((long)pvVar22 + 0x40) = lVar27 * lVar20;
            lVar27 = (long)iStack_11c;
            lVar28 = CONCAT44(uStack_134,local_138);
            piVar26 = *(int **)((long)local_278.data + 0x50);
            pvVar22 = (void *)(lVar25 * lVar27 * lVar28 + (long)local_148);
            if (piVar26 != (int *)0x0) {
              LOCK();
              *piVar26 = *piVar26 + -1;
              UNLOCK();
              if (*piVar26 == 0) {
                if (*(long **)((long)local_278.data + 0x68) == (long *)0x0) {
                  if (*(void **)((long)local_278.data + 0x48) != (void *)0x0) {
                    free(*(void **)((long)local_278.data + 0x48));
                  }
                }
                else {
                  (**(code **)(**(long **)((long)local_278.data + 0x68) + 0x18))();
                }
              }
            }
            *(void **)((long)pvVar13 + 0x48) = pvVar22;
            *(long *)((long)pvVar13 + 0x50) = 0;
            *(long *)((long)pvVar13 + 0x58) = lVar28;
            *(undefined4 *)((long)pvVar13 + 0x60) = uVar15;
            *(long **)((long)pvVar13 + 0x68) = plVar16;
            *(undefined4 *)((long)pvVar13 + 0x70) = 2;
            *(int *)((long)pvVar13 + 0x74) = iVar3;
            *(int *)((long)pvVar13 + 0x78) = iVar18;
            *(undefined8 *)((long)pvVar13 + 0x7c) = 0x100000001;
            *(long *)((long)pvVar13 + 0x88) = lVar27 * lVar20;
            if (*local_2d0 != 0) {
              local_378.elemsize._4_4_ = (undefined4)(local_328.elemsize >> 0x20);
              if (local_328.dims == 3) {
                local_378.data =
                     (void *)((long)(_func_int ***)local_328.data +
                             local_328.cstep * local_388 * local_328.elemsize);
                local_378.refcount._0_4_ = 0;
                local_378.refcount._4_4_ = 0;
                local_378.d = 1;
                local_378.c = local_328.d;
                local_378.cstep =
                     ((long)local_328.h * (long)local_328.w * local_328.elemsize + 0xf &
                     0xfffffffffffffff0) / local_328.elemsize;
                local_378.dims = 2;
              }
              else {
                piVar26 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
                local_378.data = local_328.data;
                local_378.refcount._0_4_ = (int)local_328.refcount;
                local_378.refcount._4_4_ = local_328.refcount._4_4_;
                local_378.dims = local_328.dims;
                local_378.d = local_328.d;
                local_378.c = local_328.c;
                local_378.cstep = local_328.cstep;
                if (piVar26 != (int *)0x0) {
                  LOCK();
                  *piVar26 = *piVar26 + 1;
                  UNLOCK();
                }
              }
              local_378.h = local_328.h;
              local_378.w = local_328.w;
              local_378.allocator = local_328.allocator;
              local_378.elempack = local_328.elempack;
              local_378.elemsize._0_4_ = (undefined4)local_328.elemsize;
              std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_278,&local_378);
              piVar26 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
              if (piVar26 != (int *)0x0) {
                LOCK();
                *piVar26 = *piVar26 + -1;
                UNLOCK();
                if (*piVar26 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    if ((Allocator *)local_378.data != (Allocator *)0x0) {
                      free(local_378.data);
                    }
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                      (&local_78,1,(allocator_type *)&local_378);
            pMVar21 = local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar3 = local_1e8.w;
            pAVar14 = local_1e8.allocator;
            iVar19 = local_1e8.elempack;
            lVar28 = (long)local_1e8.w;
            sVar9 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
            pvVar22 = (void *)(local_330 * lVar28 * sVar9 + (long)local_1e8.data);
            piVar26 = (local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->refcount;
            if (piVar26 != (int *)0x0) {
              LOCK();
              *piVar26 = *piVar26 + -1;
              UNLOCK();
              if (*piVar26 == 0) {
                if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                  if ((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_start)->data != (void *)0x0) {
                    free((local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start)->data);
                  }
                }
                else {
                  (*(local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
                }
              }
            }
            lVar27 = local_1a0;
            this = local_2d8;
            pMVar21->data = pvVar22;
            pMVar21->refcount = (int *)0x0;
            pMVar21->elemsize = sVar9;
            pMVar21->elempack = iVar19;
            pMVar21->allocator = pAVar14;
            pMVar21->dims = 2;
            pMVar21->w = iVar3;
            pMVar21->h = _w;
            pMVar21->d = 1;
            pMVar21->c = 1;
            pMVar21->cstep = lVar28 * local_1a0;
            local_378.refcount._0_4_ = (int)local_188._8_8_;
            local_378.refcount._4_4_ = SUB84(local_188._8_8_,4);
            local_378.elemsize._0_4_ = (undefined4)local_188._16_8_;
            local_378.elemsize._4_4_ = SUB84(local_188._16_8_,4);
            local_378.elempack = (int)local_188._24_8_;
            local_378._28_4_ = SUB84(local_188._24_8_,4);
            local_378.allocator = (Allocator *)local_188._32_8_;
            local_378.dims = (int)local_188._40_8_;
            local_378.w = SUB84(local_188._40_8_,4);
            local_378.h = (int)local_188._48_8_;
            local_378.d = SUB84(local_188._48_8_,4);
            local_378.c = (int)local_188._56_8_;
            local_378._60_4_ = SUB84(local_188._56_8_,4);
            local_378.data = (void *)CONCAT44(1,(int)local_188._0_8_);
            iVar19 = (*local_2d8->qk_gemm->_vptr_Layer[6])
                               (local_2d8->qk_gemm,&local_278,&local_78,&local_378);
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[local_388] = iVar19;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_78);
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_278);
            local_388 = local_388 + 1;
            iVar3 = (this->super_MultiHeadAttention).num_heads;
            local_330 = local_330 + lVar27;
            lVar25 = lVar25 + lVar20;
          } while (local_388 < iVar3);
          if (0 < iVar3) {
            lVar20 = 0;
            do {
              iVar19 = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar20];
              if (iVar19 != 0) goto LAB_00525500;
              lVar20 = lVar20 + 1;
            } while (iVar3 != lVar20);
          }
        }
        piVar26 = (int *)CONCAT44(uStack_ec,uStack_f0);
        if (piVar26 != (int *)0x0) {
          LOCK();
          *piVar26 = *piVar26 + -1;
          UNLOCK();
          if (*piVar26 == 0) {
            if (local_d8 == (long *)0x0) {
              if (local_f8 != (void *)0x0) {
                free(local_f8);
              }
            }
            else {
              (**(code **)(*local_d8 + 0x18))();
            }
          }
        }
        local_b8 = 0;
        local_f8 = (void *)0x0;
        uStack_f0 = 0;
        uStack_ec = 0;
        local_e8 = 0;
        uStack_e4 = 0;
        local_e0 = 0;
        uStack_d0 = 0;
        iStack_cc = 0;
        uStack_c8 = 0;
        uStack_c4 = 0;
        local_c0 = 0;
        piVar26 = (int *)CONCAT44(uStack_13c,uStack_140);
        if (piVar26 != (int *)0x0) {
          LOCK();
          *piVar26 = *piVar26 + -1;
          UNLOCK();
          if (*piVar26 == 0) {
            if (local_128 == (long *)0x0) {
              if (local_148 != (void *)0x0) {
                free(local_148);
              }
            }
            else {
              (**(code **)(*local_128 + 0x18))();
            }
          }
        }
        local_108 = 0;
        local_148 = (void *)0x0;
        uStack_140 = 0;
        uStack_13c = 0;
        local_138 = 0;
        uStack_134 = 0;
        local_130 = 0;
        uStack_120 = 0;
        iStack_11c = 0;
        uStack_118 = 0;
        uStack_114 = 0;
        local_110 = 0;
        iVar19 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_1e8,local_188);
        if (iVar19 == 0) {
          local_378.cstep = 0;
          local_378.data = (Allocator *)0x0;
          local_378.refcount._0_4_ = 0;
          local_378.refcount._4_4_ = 0;
          local_378.elemsize._0_4_ = 0;
          local_378.elemsize._4_4_ = 0;
          local_378.elempack = 0;
          local_378.allocator = (Allocator *)0x0;
          local_378.dims = 0;
          local_378.w = 0;
          local_378.h = 0;
          local_378.d = 0;
          local_378.c = 0;
          iVar19 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_190,&local_378,local_188);
          if (iVar19 == 0) {
            local_278.cstep = 0;
            local_278.data = (long *)0x0;
            local_278.refcount._0_4_ = 0;
            local_278.refcount._4_4_ = 0;
            local_278.elemsize._0_4_ = 0;
            local_278.elemsize._4_4_ = 0;
            local_278.elempack = 0;
            local_278.allocator = (Allocator *)0x0;
            local_278.dims = 0;
            local_278.w = 0;
            local_278.h = 0;
            local_278.d = 0;
            local_278.c = 0;
            Mat::create(&local_278,_w,(this->super_MultiHeadAttention).num_heads * iVar18,4,
                        (Allocator *)local_188._8_8_);
            iVar19 = -100;
            if (((long *)local_278.data != (long *)0x0) &&
               ((long)local_278.c * local_278.cstep != 0)) {
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<int,_std::allocator<int>_>::resize
                        (&local_228,(long)(this->super_MultiHeadAttention).num_heads);
              if (0 < (this->super_MultiHeadAttention).num_heads) {
                lVar25 = (long)iVar18;
                lVar20 = 0;
                local_390 = 0;
                piVar26 = (int *)0x0;
                local_2d8 = this;
                do {
                  local_2d0 = piVar26;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&local_a8,2,(allocator_type *)&local_78);
                  pMVar21 = local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar3 = local_1e8.w;
                  pAVar14 = local_1e8.allocator;
                  iVar19 = local_1e8.elempack;
                  lVar28 = (long)local_1e8.w;
                  sVar9 = CONCAT44(local_1e8.elemsize._4_4_,(undefined4)local_1e8.elemsize);
                  pvVar22 = (void *)(lVar20 * lVar28 * sVar9 + (long)local_1e8.data);
                  piVar26 = (local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->refcount;
                  local_330 = lVar20;
                  if (piVar26 != (int *)0x0) {
                    LOCK();
                    *piVar26 = *piVar26 + -1;
                    UNLOCK();
                    if (*piVar26 == 0) {
                      if ((local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0)
                      {
                        if ((local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                          free((local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start)->data);
                        }
                      }
                      else {
                        (*(local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])
                                  ();
                      }
                    }
                  }
                  pMVar5 = local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  iVar12 = local_378.w;
                  pAVar11 = local_378.allocator;
                  iVar4 = local_378.elempack;
                  pMVar21->data = pvVar22;
                  pMVar21->refcount = (int *)0x0;
                  pMVar21->elemsize = sVar9;
                  pMVar21->elempack = iVar19;
                  pMVar21->allocator = pAVar14;
                  pMVar21->dims = 2;
                  pMVar21->w = iVar3;
                  pMVar21->h = _w;
                  pMVar21->d = 1;
                  pMVar21->c = 1;
                  pMVar21->cstep = lVar28 * _w;
                  lVar20 = (long)local_378.w;
                  sVar9 = CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
                  piVar26 = local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].refcount;
                  ppp_Var10 = (_func_int ***)local_378.data;
                  if (piVar26 != (int *)0x0) {
                    LOCK();
                    *piVar26 = *piVar26 + -1;
                    UNLOCK();
                    if (*piVar26 == 0) {
                      if (local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                          .super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                        if (local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start[1].data != (void *)0x0) {
                          free(local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                               _M_impl.super__Vector_impl_data._M_start[1].data);
                        }
                      }
                      else {
                        (*(local_a8.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator
                          [3])();
                      }
                    }
                  }
                  pMVar5[1].data = (Allocator *)((long)ppp_Var10 + local_390 * lVar20 * sVar9);
                  pMVar5[1].refcount = (int *)0x0;
                  pMVar5[1].elemsize = sVar9;
                  pMVar5[1].elempack = iVar4;
                  pMVar5[1].allocator = pAVar11;
                  pMVar5[1].dims = 2;
                  pMVar5[1].w = iVar12;
                  pMVar5[1].h = iVar18;
                  pMVar5[1].d = 1;
                  pMVar5[1].c = 1;
                  pMVar5[1].cstep = lVar20 * lVar25;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                            (&local_90,1,(allocator_type *)&local_78);
                  pMVar21 = local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar3 = local_278.w;
                  pAVar14 = local_278.allocator;
                  iVar19 = local_278.elempack;
                  lVar20 = (long)local_278.w;
                  sVar9 = CONCAT44(local_278.elemsize._4_4_,(undefined4)local_278.elemsize);
                  plVar23 = (long *)((long)local_278.data + local_390 * lVar20 * sVar9);
                  piVar26 = (local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->refcount;
                  if (piVar26 != (int *)0x0) {
                    LOCK();
                    *piVar26 = *piVar26 + -1;
                    UNLOCK();
                    if (*piVar26 == 0) {
                      if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0)
                      {
                        if ((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                             _M_impl.super__Vector_impl_data._M_start)->data != (void *)0x0) {
                          free((local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start)->data);
                        }
                      }
                      else {
                        (*(local_90.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])
                                  ();
                      }
                    }
                  }
                  this = local_2d8;
                  pMVar21->data = plVar23;
                  pMVar21->refcount = (int *)0x0;
                  pMVar21->elemsize = sVar9;
                  pMVar21->elempack = iVar19;
                  pMVar21->allocator = pAVar14;
                  pMVar21->dims = 2;
                  pMVar21->w = iVar3;
                  pMVar21->h = iVar18;
                  pMVar21->d = 1;
                  pMVar21->c = 1;
                  pMVar21->cstep = lVar20 * lVar25;
                  local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)local_188._8_8_;
                  local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)local_188._16_8_;
                  iStack_60 = local_188._24_4_;
                  bStack_5c = (bool)local_188[0x1c];
                  bStack_5b = (bool)local_188[0x1d];
                  bStack_5a = (bool)local_188[0x1e];
                  bStack_59 = (bool)local_188[0x1f];
                  local_58 = (Allocator *)local_188._32_8_;
                  iStack_50 = local_188._40_4_;
                  bStack_4c = (bool)local_188[0x2c];
                  bStack_4b = (bool)local_188[0x2d];
                  bStack_4a = (bool)local_188[0x2e];
                  bStack_49 = (bool)local_188[0x2f];
                  iStack_48 = local_188._48_4_;
                  bStack_44 = (bool)local_188[0x34];
                  bStack_43 = (bool)local_188[0x35];
                  bStack_42 = (bool)local_188[0x36];
                  bStack_41 = (bool)local_188[0x37];
                  bStack_40 = (bool)local_188[0x38];
                  bStack_3f = (bool)local_188[0x39];
                  bStack_3e = (bool)local_188[0x3a];
                  bStack_3d = (bool)local_188[0x3b];
                  bStack_3c = (bool)local_188[0x3c];
                  bStack_3b = (bool)local_188[0x3d];
                  bStack_3a = (bool)local_188[0x3e];
                  bStack_39 = (bool)local_188[0x3f];
                  local_78.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)CONCAT44(1,(int)local_188._0_8_);
                  iVar19 = (*local_2d8->qkv_gemm->_vptr_Layer[6])
                                     (local_2d8->qkv_gemm,&local_a8,&local_90,&local_78);
                  piVar26 = local_2d0;
                  local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)local_2d0] = iVar19;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_90);
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&local_a8);
                  piVar26 = (int *)((long)piVar26 + 1);
                  iVar3 = (this->super_MultiHeadAttention).num_heads;
                  local_390 = local_390 + lVar25;
                  lVar20 = local_330 + _w;
                } while ((long)piVar26 < (long)iVar3);
                if (0 < iVar3) {
                  lVar20 = 0;
                  do {
                    iVar19 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar20];
                    if (iVar19 != 0) goto LAB_00525a7c;
                    lVar20 = lVar20 + 1;
                  } while (iVar3 != lVar20);
                }
              }
              piVar26 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
              if (piVar26 != (int *)0x0) {
                LOCK();
                *piVar26 = *piVar26 + -1;
                UNLOCK();
                if (*piVar26 == 0) {
                  if (local_378.allocator == (Allocator *)0x0) {
                    if ((Allocator *)local_378.data != (Allocator *)0x0) {
                      free(local_378.data);
                    }
                  }
                  else {
                    (*(local_378.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              local_378.cstep = 0;
              local_378.data = (Allocator *)0x0;
              local_378.refcount._0_4_ = 0;
              local_378.refcount._4_4_ = 0;
              local_378.elemsize._0_4_ = 0;
              local_378.elemsize._4_4_ = 0;
              local_378.elempack = 0;
              local_378.dims = 0;
              local_378.w = 0;
              local_378.h = 0;
              local_378.d = 0;
              local_378.c = 0;
              iVar19 = (*this->o_gemm->_vptr_Layer[7])
                                 (this->o_gemm,&local_278,
                                  (local_198->
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                                  .super__Vector_impl_data._M_start,local_188);
              if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_00525a7c:
                operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_228.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_228.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
            }
            piVar26 = (int *)CONCAT44(local_278.refcount._4_4_,local_278.refcount._0_4_);
            if (piVar26 != (int *)0x0) {
              LOCK();
              *piVar26 = *piVar26 + -1;
              UNLOCK();
              if (*piVar26 == 0) {
                if (local_278.allocator == (Allocator *)0x0) {
                  if ((long *)local_278.data != (long *)0x0) {
                    free(local_278.data);
                  }
                }
                else {
                  (*(local_278.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          piVar26 = (int *)CONCAT44(local_378.refcount._4_4_,(int)local_378.refcount);
          if (piVar26 != (int *)0x0) {
            LOCK();
            *piVar26 = *piVar26 + -1;
            UNLOCK();
            if (*piVar26 == 0) {
              if (local_378.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_378.data != (Allocator *)0x0) {
                  free(local_378.data);
                }
              }
              else {
                (*(local_378.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
LAB_00525500:
          operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      piVar26 = (int *)CONCAT44(local_1e8.refcount._4_4_,local_1e8.refcount._0_4_);
      if (piVar26 != (int *)0x0) {
        LOCK();
        *piVar26 = *piVar26 + -1;
        UNLOCK();
        if (*piVar26 == 0) {
          if (local_1e8.allocator == (Allocator *)0x0) {
            if (local_1e8.data != (void *)0x0) {
              free(local_1e8.data);
            }
          }
          else {
            (*(local_1e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar26 = (int *)CONCAT44(uStack_13c,uStack_140);
    if (piVar26 != (int *)0x0) {
      LOCK();
      *piVar26 = *piVar26 + -1;
      UNLOCK();
      if (*piVar26 == 0) {
        if (local_128 == (long *)0x0) {
          if (local_148 != (void *)0x0) {
            free(local_148);
          }
        }
        else {
          (**(code **)(*local_128 + 0x18))();
        }
      }
    }
  }
  piVar26 = (int *)CONCAT44(uStack_ec,uStack_f0);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_d8 == (long *)0x0) {
        if (local_f8 != (void *)0x0) {
          free(local_f8);
        }
      }
      else {
        (**(code **)(*local_d8 + 0x18))();
      }
    }
  }
LAB_00525393:
  piVar26 = (int *)CONCAT44(local_328.refcount._4_4_,(int)local_328.refcount);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_328.data != (Allocator *)0x0) {
          free(local_328.data);
        }
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar26 = (int *)CONCAT44(local_2c8.refcount._4_4_,(int)local_2c8.refcount);
  if (piVar26 != (int *)0x0) {
    LOCK();
    *piVar26 = *piVar26 + -1;
    UNLOCK();
    if (*piVar26 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_2c8.data != (Allocator *)0x0) {
          free(local_2c8.data);
        }
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int MultiHeadAttention_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}